

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O0

void __thiscall deqp::gles31::Functional::UniformCase::~UniformCase(UniformCase *this)

{
  code *pcVar1;
  UniformCase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

UniformCase::~UniformCase (void)
{
	UniformCase::deinit();
}